

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void cdef_restoration_frame
               (AV1_COMP *cpi,AV1_COMMON *cm,MACROBLOCKD *xd,int use_restoration,int use_cdef,
               uint skip_apply_postproc_filters)

{
  int iVar1;
  AV1_COMMON *cm_00;
  int in_ECX;
  MACROBLOCKD *in_RDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  cdef_init_fb_row_t unaff_retaddr;
  int in_stack_00000008;
  int do_extend_border_1;
  int num_workers_1;
  MultiThreadInfo *mt_info;
  int use_superres;
  int do_extend_border;
  int num_workers;
  AV1_COMP *in_stack_00000150;
  AV1_COMP *in_stack_000001f8;
  YV12_BUFFER_CONFIG *in_stack_00000200;
  int in_stack_ffffffffffffffb0;
  MULTI_THREADED_MODULES in_stack_ffffffffffffffb4;
  AV1_COMP *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int optimized_lr;
  cdef_init_fb_row_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int do_extend_border_00;
  
  if (in_ECX != 0) {
    av1_loop_restoration_save_boundary_lines
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (AV1_COMMON *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  if (in_R8D != 0) {
    in_stack_ffffffffffffffd8 = *(int *)(in_RDI + 0x9ae68);
    av1_cdef_search(in_stack_00000150);
    if ((in_R9D & 4) == 0) {
      if (in_stack_ffffffffffffffd8 < 2) {
        av1_cdef_frame((YV12_BUFFER_CONFIG *)CONCAT44(in_ECX,in_R8D),
                       (AV1_COMMON *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                       (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
      }
      else {
        in_stack_ffffffffffffffb0 =
             extend_borders_mt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                               in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffb0;
        av1_cdef_frame_mt(in_RSI,in_RDX,(AV1CdefWorkerData *)CONCAT44(in_ECX,in_R8D),
                          (AVxWorker *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                          (AV1CdefSync *)
                          CONCAT44(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffd0),
                          (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),unaff_retaddr,
                          in_stack_00000008);
      }
    }
  }
  iVar1 = av1_superres_scaled(in_RSI);
  if ((iVar1 != 0) && ((in_R9D & 2) == 0)) {
    av1_superres_post_encode
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if (in_ECX != 0) {
    cm_00 = (AV1_COMMON *)(in_RDI + 0x9ae48);
    optimized_lr = *(int *)(in_RDI + 0x9ae6c);
    av1_loop_restoration_save_boundary_lines
              ((YV12_BUFFER_CONFIG *)CONCAT44(optimized_lr,in_stack_ffffffffffffffc0),
               (AV1_COMMON *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    do_extend_border_00 = (int)in_RDI;
    av1_pick_filter_restoration(in_stack_00000200,in_stack_000001f8);
    if (((in_R9D & 1) == 0) &&
       (((in_RSI->rst_info[0].frame_restoration_type != RESTORE_NONE ||
         (in_RSI->rst_info[1].frame_restoration_type != RESTORE_NONE)) ||
        (in_RSI->rst_info[2].frame_restoration_type != RESTORE_NONE)))) {
      if (optimized_lr < 2) {
        av1_loop_restoration_filter_frame
                  ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),cm_00,
                   optimized_lr,in_stack_ffffffffffffffb8);
      }
      else {
        av1_loop_restoration_filter_frame_mt
                  ((YV12_BUFFER_CONFIG *)CONCAT44(in_ECX,in_R8D),
                   (AV1_COMMON *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd4,(AVxWorker *)cm_00,optimized_lr,
                   (AV1LrSync *)in_stack_ffffffffffffffb8,in_RSI,do_extend_border_00);
      }
    }
  }
  return;
}

Assistant:

static void cdef_restoration_frame(AV1_COMP *cpi, AV1_COMMON *cm,
                                   MACROBLOCKD *xd, int use_restoration,
                                   int use_cdef,
                                   unsigned int skip_apply_postproc_filters) {
#if !CONFIG_REALTIME_ONLY
  if (use_restoration)
    av1_loop_restoration_save_boundary_lines(&cm->cur_frame->buf, cm, 0);
#else
  (void)use_restoration;
#endif

  if (use_cdef) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, cdef_time);
#endif
    const int num_workers = cpi->mt_info.num_mod_workers[MOD_CDEF];
    // Find CDEF parameters
    av1_cdef_search(cpi);

    // Apply the filter
    if ((skip_apply_postproc_filters & SKIP_APPLY_CDEF) == 0) {
      assert(!cpi->ppi->rtc_ref.non_reference_frame);
      if (num_workers > 1) {
        // Extension of frame borders is multi-threaded along with cdef.
        const int do_extend_border =
            extend_borders_mt(cpi, MOD_CDEF, /* plane */ 0);
        av1_cdef_frame_mt(cm, xd, cpi->mt_info.cdef_worker,
                          cpi->mt_info.workers, &cpi->mt_info.cdef_sync,
                          num_workers, av1_cdef_init_fb_row_mt,
                          do_extend_border);
      } else {
        av1_cdef_frame(&cm->cur_frame->buf, cm, xd, av1_cdef_init_fb_row);
      }
    }
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, cdef_time);
#endif
  }

  const int use_superres = av1_superres_scaled(cm);
  if (use_superres) {
    if ((skip_apply_postproc_filters & SKIP_APPLY_SUPERRES) == 0) {
      av1_superres_post_encode(cpi);
    }
  }

#if !CONFIG_REALTIME_ONLY
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, loop_restoration_time);
#endif
  if (use_restoration) {
    MultiThreadInfo *const mt_info = &cpi->mt_info;
    const int num_workers = mt_info->num_mod_workers[MOD_LR];
    av1_loop_restoration_save_boundary_lines(&cm->cur_frame->buf, cm, 1);
    av1_pick_filter_restoration(cpi->source, cpi);
    if ((skip_apply_postproc_filters & SKIP_APPLY_RESTORATION) == 0 &&
        (cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
         cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
         cm->rst_info[2].frame_restoration_type != RESTORE_NONE)) {
      if (num_workers > 1) {
        // Extension of frame borders is multi-threaded along with loop
        // restoration filter.
        const int do_extend_border = 1;
        av1_loop_restoration_filter_frame_mt(
            &cm->cur_frame->buf, cm, 0, mt_info->workers, num_workers,
            &mt_info->lr_row_sync, &cpi->lr_ctxt, do_extend_border);
      } else {
        av1_loop_restoration_filter_frame(&cm->cur_frame->buf, cm, 0,
                                          &cpi->lr_ctxt);
      }
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, loop_restoration_time);
#endif
#endif  // !CONFIG_REALTIME_ONLY
}